

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O3

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,char c)

{
  char *__s;
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  sc_string_rep *r;
  char *__dest;
  int iVar5;
  char in_DL;
  undefined7 in_register_00000031;
  
  __s = *(char **)(*(long *)CONCAT71(in_register_00000031,c) + 8);
  sVar4 = strlen(__s);
  r = (sc_string_rep *)operator_new(0x10);
  iVar1 = (int)sVar4;
  uVar2 = iVar1 + 0x10;
  if (-1 < (int)(iVar1 + 1U)) {
    uVar2 = iVar1 + 1U;
  }
  r->ref_count = 1;
  iVar5 = (uVar2 & 0xfffffff0) + 0x10;
  r->alloc = iVar5;
  iVar3 = -1;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  __dest = (char *)operator_new__((long)iVar3);
  r->str = __dest;
  *__dest = '\0';
  strcpy(__dest,__s);
  __dest[iVar1] = in_DL;
  __dest[(long)iVar1 + 1] = '\0';
  sc_string_old(this,r);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old sc_string_old::operator+(char c) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + 2 );
    strcpy( r->str, rep->str );
    r->str[len] = c;
    r->str[len+1] = 00;
    return sc_string_old(r);
}